

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

size_t __thiscall
CVmObjByteArray::map_to_string
          (CVmObjByteArray *this,unsigned_long idx,unsigned_long len,CVmObjString *str,
          size_t str_len,CCharmapToUni *mapper)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  long lVar3;
  ulong len_00;
  size_t sVar4;
  size_t partial_len;
  char *dst;
  uchar buf [128];
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  uchar local_b8 [136];
  
  if (str == (CVmObjString *)0x0) {
    local_c8 = (char *)0x0;
  }
  else {
    local_c8 = (str->super_CVmObject).ext_ + 2;
  }
  if (len == 0) {
    sVar2 = 0;
  }
  else {
    sVar4 = 0;
    sVar2 = 0;
    local_c0 = str_len;
    do {
      len_00 = 0x80 - sVar4;
      if (len <= 0x80 - sVar4) {
        len_00 = len;
      }
      copy_to_buf(this,local_b8,idx,len_00);
      lVar3 = sVar4 + len_00;
      iVar1 = (*(mapper->super_CCharmap)._vptr_CCharmap[5])
                        (mapper,&local_c8,&local_c0,local_b8,lVar3,&local_d0);
      sVar4 = local_d0;
      if (0xfffffffd - sVar2 < CONCAT44(extraout_var,iVar1)) {
        err_throw(0xca);
      }
      if (local_d0 != 0) {
        memmove(local_b8,local_b8 + (lVar3 - local_d0),local_d0);
      }
      idx = idx + len_00;
      len = len - len_00;
      sVar2 = sVar2 + CONCAT44(extraout_var,iVar1);
    } while (len != 0);
  }
  return sVar2;
}

Assistant:

size_t CVmObjByteArray::map_to_string(unsigned long idx,
                                      unsigned long len,
                                      CVmObjString *str, size_t str_len,
                                      CCharmapToUni *mapper)
{
    size_t str_total;
    size_t buf_len;
    unsigned char buf[128];
    char *dst;

    /* get the string's buffer pointer */
    dst = (str != 0 ? str->cons_get_buf() : 0);
    
    /* go through the source bytes a bit at a time */
    for (str_total = 0, buf_len = 0 ; len != 0 ; )
    {
        size_t copy_len;
        size_t str_cur;
        size_t partial_len;
        
        /* 
         *   fill up the buffer, up to the remaining source length or the
         *   buffer's capacity, whichever is lower 
         */
        copy_len = sizeof(buf) - buf_len;
        if (copy_len > len)
            copy_len = (size_t)len;

        /* copy the bytes to our staging buffer */
        copy_to_buf(buf, idx, copy_len);

        /* add the copied bytes into the buffer length */
        buf_len += copy_len;

        /* advance past the copied bytes in the source */
        idx += copy_len;
        len -= copy_len;

        /* translate the bytes through the character set mapping */
        str_cur = mapper->map2(&dst, &str_len, (char *)buf, buf_len,
                               &partial_len);

        /* 
         *   if this would push us over the maximum string size, we can't
         *   convert the data 
         */
        if (str_cur > OSMALMAX - str_total - VMB_LEN)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* add the current length into the total string length */
        str_total += str_cur;

        /* copy the partial last character bytes to the start of the buffer */
        if (partial_len != 0)
            memmove(buf, buf + buf_len - partial_len, partial_len);

        /* the buffer now contains only the partial character bytes */
        buf_len = partial_len;
    }

    /* return the total string length */
    return str_total;
}